

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O0

char * __cxxabiv1::anon_unknown_0::parse_block_invoke<__cxxabiv1::(anonymous_namespace)::Db>
                 (char *first,char *last,Db *db)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  *in_RDX;
  char *in_RSI;
  char *in_RDI;
  int i;
  char *t;
  char test [14];
  uint in_stack_ffffffffffffffc0;
  int iVar3;
  char *local_38;
  undefined2 in_stack_ffffffffffffffd0;
  undefined6 uVar4;
  undefined2 uVar5;
  undefined4 uVar6;
  undefined2 uVar7;
  char *local_10;
  
  local_10 = in_RDI;
  if (0xc < (long)in_RSI - (long)in_RDI) {
    uVar4 = 0x6b636f6c625f;
    uVar5 = 0x695f;
    uVar6 = 0x6b6f766e;
    uVar7 = 0x65;
    local_38 = in_RDI;
    for (iVar3 = 0; iVar3 < 0xd; iVar3 = iVar3 + 1) {
      if (*local_38 != (&stack0xffffffffffffffd2)[iVar3]) {
        return in_RDI;
      }
      local_38 = local_38 + 1;
    }
    if (local_38 != in_RSI) {
      if (*local_38 == '_') {
        if (local_38 + 1 == in_RSI) {
          return in_RDI;
        }
        iVar2 = isdigit((int)local_38[1]);
        if (iVar2 == 0) {
          return in_RDI;
        }
        local_38 = local_38 + 2;
      }
      while( true ) {
        in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 & 0xffffff;
        if (local_38 != in_RSI) {
          iVar2 = isdigit((int)*local_38);
          in_stack_ffffffffffffffc0 = CONCAT13(iVar2 != 0,(int3)in_stack_ffffffffffffffc0);
        }
        if ((char)(in_stack_ffffffffffffffc0 >> 0x18) == '\0') break;
        local_38 = local_38 + 1;
      }
    }
    bVar1 = std::
            vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
            ::empty((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)CONCAT62(uVar4,in_stack_ffffffffffffffd0));
    if (bVar1) {
      return in_RDI;
    }
    std::
    vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
    ::back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
            *)CONCAT44(iVar3,in_stack_ffffffffffffffc0));
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::insert(in_RDX,CONCAT26(uVar7,CONCAT42(uVar6,uVar5)),
             (char *)CONCAT62(uVar4,in_stack_ffffffffffffffd0));
    local_10 = local_38;
  }
  return local_10;
}

Assistant:

const char*
parse_block_invoke(const char* first, const char* last, C& db)
{
    if (last - first >= 13)
    {
        const char test[] = "_block_invoke";
        const char* t = first;
        for (int i = 0; i < 13; ++i, ++t)
        {
            if (*t != test[i])
                return first;
        }
        if (t != last)
        {
            if (*t == '_')
            {
                // must have at least 1 decimal digit
                if (++t == last || !std::isdigit(*t))
                    return first;
                ++t;
            }
            // parse zero or more digits
            while (t != last && isdigit(*t))
                ++t;
        }
        if (db.names.empty())
            return first;
        db.names.back().first.insert(0, "invocation function for block in ");
        first = t;
    }
    return first;
}